

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pce.c
# Opt level: O2

void pce_incspr(int *ip)

{
  int iVar1;
  int size;
  int iVar2;
  int iVar3;
  int h;
  int w;
  int y;
  int x;
  
  labldef(loccnt,1);
  if (pass == 1) {
    loadlc(loccnt,0);
  }
  iVar1 = pcx_get_args(ip);
  if (iVar1 != 0) {
    iVar2 = 0;
    iVar1 = pcx_parse_args(0,pcx_nb_args,&x,&y,&w,&h,0x10);
    if (iVar1 != 0) {
      for (; iVar2 < h; iVar2 = iVar2 + 1) {
        iVar1 = 0;
        for (iVar3 = 0; iVar3 < w; iVar3 = iVar3 + 1) {
          size = pcx_pack_16x16_sprite(buffer,x + iVar1,y + iVar2 * 0x10);
          putbuffer(buffer,size);
          iVar1 = iVar1 + 0x10;
        }
      }
      if (pass == 1) {
        println();
      }
    }
  }
  return;
}

Assistant:

void
pce_incspr(int *ip)
{
	int i, j;
	int x, y, w, h;
	int sx, sy;
	int size;

	/* define label */
	labldef(loccnt, 1);

	/* output */
	if (pass == LAST_PASS)
		loadlc(loccnt, 0);

	/* get args */
	if (!pcx_get_args(ip))
		return;
	if (!pcx_parse_args(0, pcx_nb_args, &x, &y, &w, &h, 16))
		return;

	/* pack sprites */
	for (i = 0; i < h; i++) {
		for (j = 0; j < w; j++) {
			/* sprite coordinates */
			sx = x + (j << 4);
			sy = y + (i << 4);

			/* encode sprite */
			size = pcx_pack_16x16_sprite(buffer, sx, sy);

			/* store sprite */
			putbuffer(buffer, size);
		}
	}

	/* output */
	if (pass == LAST_PASS)
		println();
}